

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_receiver.c
# Opt level: O3

void decode_message_value_callback(void *context,AMQP_VALUE decoded_value)

{
  MESSAGE_HANDLE message;
  _Bool _Var1;
  int iVar2;
  AMQP_VALUE pAVar3;
  LOGGER_LOG p_Var4;
  char *pcVar5;
  BINARY_DATA amqp_data;
  PROPERTIES_HANDLE properties;
  MESSAGE_BODY_TYPE body_type_1;
  amqp_binary local_38;
  MESSAGE_BODY_TYPE local_24;
  
  message = *(MESSAGE_HANDLE *)((long)context + 0x30);
  pAVar3 = amqpvalue_get_inplace_descriptor(decoded_value);
  _Var1 = is_application_properties_type_by_descriptor(pAVar3);
  if (_Var1) {
    iVar2 = message_set_application_properties(message,decoded_value);
    if (iVar2 == 0) {
      return;
    }
    p_Var4 = xlogging_get_log_function();
    if (p_Var4 == (LOGGER_LOG)0x0) goto LAB_0016c54a;
    pcVar5 = "Error setting application properties on received message";
    iVar2 = 0x2f;
  }
  else {
    _Var1 = is_properties_type_by_descriptor(pAVar3);
    if (_Var1) {
      iVar2 = amqpvalue_get_properties(decoded_value,(PROPERTIES_HANDLE *)&local_38);
      if (iVar2 == 0) {
        iVar2 = message_set_properties
                          (message,(PROPERTIES_HANDLE)
                                   CONCAT44(local_38.bytes._4_4_,(int)local_38.bytes));
        if (iVar2 != 0) {
          p_Var4 = xlogging_get_log_function();
          if (p_Var4 != (LOGGER_LOG)0x0) {
            (*p_Var4)(AZ_LOG_ERROR,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/message_receiver.c"
                      ,"decode_message_value_callback",0x3f,1,
                      "Error setting message properties on received message");
          }
          *(undefined1 *)((long)context + 0x38) = 1;
        }
        properties_destroy((PROPERTIES_HANDLE)CONCAT44(local_38.bytes._4_4_,(int)local_38.bytes));
        return;
      }
      p_Var4 = xlogging_get_log_function();
      if (p_Var4 == (LOGGER_LOG)0x0) goto LAB_0016c54a;
      pcVar5 = "Error getting message properties";
      iVar2 = 0x38;
    }
    else {
      _Var1 = is_delivery_annotations_type_by_descriptor(pAVar3);
      if (_Var1) {
        pAVar3 = amqpvalue_get_inplace_described_value(decoded_value);
        if (pAVar3 == (AMQP_VALUE)0x0) {
          p_Var4 = xlogging_get_log_function();
          if (p_Var4 == (LOGGER_LOG)0x0) goto LAB_0016c54a;
          pcVar5 = "Error getting delivery annotations";
          iVar2 = 0x4b;
        }
        else {
          iVar2 = message_set_delivery_annotations(message,pAVar3);
          if (iVar2 == 0) {
            return;
          }
          p_Var4 = xlogging_get_log_function();
          if (p_Var4 == (LOGGER_LOG)0x0) goto LAB_0016c54a;
          pcVar5 = "Error setting delivery annotations on received message";
          iVar2 = 0x52;
        }
      }
      else {
        _Var1 = is_message_annotations_type_by_descriptor(pAVar3);
        if (_Var1) {
          pAVar3 = amqpvalue_get_inplace_described_value(decoded_value);
          if (pAVar3 == (AMQP_VALUE)0x0) {
            p_Var4 = xlogging_get_log_function();
            if (p_Var4 == (LOGGER_LOG)0x0) goto LAB_0016c54a;
            pcVar5 = "Error getting message annotations";
            iVar2 = 0x5c;
          }
          else {
            iVar2 = message_set_message_annotations(message,pAVar3);
            if (iVar2 == 0) {
              return;
            }
            p_Var4 = xlogging_get_log_function();
            if (p_Var4 == (LOGGER_LOG)0x0) goto LAB_0016c54a;
            pcVar5 = "Error setting message annotations on received message";
            iVar2 = 99;
          }
        }
        else {
          _Var1 = is_header_type_by_descriptor(pAVar3);
          if (_Var1) {
            iVar2 = amqpvalue_get_header(decoded_value,(HEADER_HANDLE *)&local_38);
            if (iVar2 == 0) {
              iVar2 = message_set_header(message,(HEADER_HANDLE)
                                                 CONCAT44(local_38.bytes._4_4_,(int)local_38.bytes))
              ;
              if (iVar2 != 0) {
                p_Var4 = xlogging_get_log_function();
                if (p_Var4 != (LOGGER_LOG)0x0) {
                  (*p_Var4)(AZ_LOG_ERROR,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/message_receiver.c"
                            ,"decode_message_value_callback",0x74,1,
                            "Error setting message header on received message");
                }
                *(undefined1 *)((long)context + 0x38) = 1;
              }
              header_destroy((HEADER_HANDLE)CONCAT44(local_38.bytes._4_4_,(int)local_38.bytes));
              return;
            }
            p_Var4 = xlogging_get_log_function();
            if (p_Var4 == (LOGGER_LOG)0x0) goto LAB_0016c54a;
            pcVar5 = "Error getting message header";
            iVar2 = 0x6d;
          }
          else {
            _Var1 = is_footer_type_by_descriptor(pAVar3);
            if (_Var1) {
              pAVar3 = amqpvalue_get_inplace_described_value(decoded_value);
              if (pAVar3 == (AMQP_VALUE)0x0) {
                p_Var4 = xlogging_get_log_function();
                if (p_Var4 == (LOGGER_LOG)0x0) goto LAB_0016c54a;
                pcVar5 = "Error getting message footer";
                iVar2 = 0x80;
              }
              else {
                iVar2 = message_set_footer(message,pAVar3);
                if (iVar2 == 0) {
                  return;
                }
                p_Var4 = xlogging_get_log_function();
                if (p_Var4 == (LOGGER_LOG)0x0) goto LAB_0016c54a;
                pcVar5 = "Error setting message footer on received message";
                iVar2 = 0x87;
              }
            }
            else {
              _Var1 = is_amqp_value_type_by_descriptor(pAVar3);
              if (_Var1) {
                iVar2 = message_get_body_type(message,(MESSAGE_BODY_TYPE *)&local_38);
                if (iVar2 == 0) {
                  if ((int)local_38.bytes == 1) {
                    pAVar3 = amqpvalue_get_inplace_described_value(decoded_value);
                    if (pAVar3 == (AMQP_VALUE)0x0) {
                      p_Var4 = xlogging_get_log_function();
                      if (p_Var4 == (LOGGER_LOG)0x0) goto LAB_0016c54a;
                      pcVar5 = "Error getting body AMQP value";
                      iVar2 = 0xa0;
                    }
                    else {
                      iVar2 = message_set_body_amqp_value(message,pAVar3);
                      if (iVar2 == 0) {
                        return;
                      }
                      p_Var4 = xlogging_get_log_function();
                      if (p_Var4 == (LOGGER_LOG)0x0) goto LAB_0016c54a;
                      pcVar5 = "Error setting body AMQP value on received message";
                      iVar2 = 0xa7;
                    }
                  }
                  else {
                    p_Var4 = xlogging_get_log_function();
                    if (p_Var4 == (LOGGER_LOG)0x0) goto LAB_0016c54a;
                    pcVar5 = "Body already set on received message";
                    iVar2 = 0x98;
                  }
                }
                else {
                  p_Var4 = xlogging_get_log_function();
                  if (p_Var4 == (LOGGER_LOG)0x0) goto LAB_0016c54a;
                  pcVar5 = "Error getting message body type";
                  iVar2 = 0x91;
                }
              }
              else {
                _Var1 = is_data_type_by_descriptor(pAVar3);
                if (_Var1) {
                  iVar2 = message_get_body_type(message,&local_24);
                  if (iVar2 == 0) {
                    if (local_24 - MESSAGE_BODY_TYPE_SEQUENCE < 0xfffffffe) {
                      p_Var4 = xlogging_get_log_function();
                      if (p_Var4 == (LOGGER_LOG)0x0) goto LAB_0016c54a;
                      pcVar5 = "Message body type already set to something different than AMQP DATA"
                      ;
                      iVar2 = 0xbb;
                    }
                    else {
                      pAVar3 = amqpvalue_get_inplace_described_value(decoded_value);
                      if (pAVar3 == (AMQP_VALUE)0x0) {
                        p_Var4 = xlogging_get_log_function();
                        if (p_Var4 == (LOGGER_LOG)0x0) goto LAB_0016c54a;
                        pcVar5 = "Error getting body DATA value";
                        iVar2 = 0xc3;
                      }
                      else {
                        iVar2 = amqpvalue_get_binary(pAVar3,&local_38);
                        if (iVar2 == 0) {
                          amqp_data.bytes._4_4_ = local_38.bytes._4_4_;
                          amqp_data.bytes._0_4_ = (int)local_38.bytes;
                          amqp_data.length._0_4_ = local_38.length;
                          amqp_data.length._4_4_ = 0;
                          iVar2 = message_add_body_amqp_data(message,amqp_data);
                          if (iVar2 == 0) {
                            return;
                          }
                          p_Var4 = xlogging_get_log_function();
                          if (p_Var4 == (LOGGER_LOG)0x0) goto LAB_0016c54a;
                          pcVar5 = "Error adding body DATA to received message";
                          iVar2 = 0xd5;
                        }
                        else {
                          p_Var4 = xlogging_get_log_function();
                          if (p_Var4 == (LOGGER_LOG)0x0) goto LAB_0016c54a;
                          pcVar5 = "Error getting body DATA AMQP value";
                          iVar2 = 0xcb;
                        }
                      }
                    }
                  }
                  else {
                    p_Var4 = xlogging_get_log_function();
                    if (p_Var4 == (LOGGER_LOG)0x0) goto LAB_0016c54a;
                    pcVar5 = "Error getting message body type";
                    iVar2 = 0xb3;
                  }
                }
                else {
                  p_Var4 = xlogging_get_log_function();
                  if (p_Var4 == (LOGGER_LOG)0x0) goto LAB_0016c54a;
                  pcVar5 = "Failed decoding descriptor";
                  iVar2 = 0xdf;
                }
              }
            }
          }
        }
      }
    }
  }
  (*p_Var4)(AZ_LOG_ERROR,
            "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/message_receiver.c"
            ,"decode_message_value_callback",iVar2,1,pcVar5);
LAB_0016c54a:
  *(undefined1 *)((long)context + 0x38) = 1;
  return;
}

Assistant:

static void decode_message_value_callback(void* context, AMQP_VALUE decoded_value)
{
    MESSAGE_RECEIVER_INSTANCE* message_receiver = (MESSAGE_RECEIVER_INSTANCE*)context;
    MESSAGE_HANDLE decoded_message = message_receiver->decoded_message;
    AMQP_VALUE descriptor = amqpvalue_get_inplace_descriptor(decoded_value);

    if (is_application_properties_type_by_descriptor(descriptor))
    {
        if (message_set_application_properties(decoded_message, decoded_value) != 0)
        {
            LogError("Error setting application properties on received message");
            message_receiver->decode_error = true;
        }
    }
    else if (is_properties_type_by_descriptor(descriptor))
    {
        PROPERTIES_HANDLE properties;
        if (amqpvalue_get_properties(decoded_value, &properties) != 0)
        {
            LogError("Error getting message properties");
            message_receiver->decode_error = true;
        }
        else
        {
            if (message_set_properties(decoded_message, properties) != 0)
            {
                LogError("Error setting message properties on received message");
                message_receiver->decode_error = true;
            }

            properties_destroy(properties);
        }
    }
    else if (is_delivery_annotations_type_by_descriptor(descriptor))
    {
        annotations delivery_annotations = amqpvalue_get_inplace_described_value(decoded_value);
        if (delivery_annotations == NULL)
        {
            LogError("Error getting delivery annotations");
            message_receiver->decode_error = true;
        }
        else
        {
            if (message_set_delivery_annotations(decoded_message, delivery_annotations) != 0)
            {
                LogError("Error setting delivery annotations on received message");
                message_receiver->decode_error = true;
            }
        }
    }
    else if (is_message_annotations_type_by_descriptor(descriptor))
    {
        annotations message_annotations = amqpvalue_get_inplace_described_value(decoded_value);
        if (message_annotations == NULL)
        {
            LogError("Error getting message annotations");
            message_receiver->decode_error = true;
        }
        else
        {
            if (message_set_message_annotations(decoded_message, message_annotations) != 0)
            {
                LogError("Error setting message annotations on received message");
                message_receiver->decode_error = true;
            }
        }
    }
    else if (is_header_type_by_descriptor(descriptor))
    {
        HEADER_HANDLE header;
        if (amqpvalue_get_header(decoded_value, &header) != 0)
        {
            LogError("Error getting message header");
            message_receiver->decode_error = true;
        }
        else
        {
            if (message_set_header(decoded_message, header) != 0)
            {
                LogError("Error setting message header on received message");
                message_receiver->decode_error = true;
            }

            header_destroy(header);
        }
    }
    else if (is_footer_type_by_descriptor(descriptor))
    {
        annotations footer = amqpvalue_get_inplace_described_value(decoded_value);
        if (footer == NULL)
        {
            LogError("Error getting message footer");
            message_receiver->decode_error = true;
        }
        else
        {
            if (message_set_footer(decoded_message, footer) != 0)
            {
                LogError("Error setting message footer on received message");
                message_receiver->decode_error = true;
            }
        }
    }
    else if (is_amqp_value_type_by_descriptor(descriptor))
    {
        MESSAGE_BODY_TYPE body_type;
        if (message_get_body_type(decoded_message, &body_type) != 0)
        {
            LogError("Error getting message body type");
            message_receiver->decode_error = true;
        }
        else
        {
            if (body_type != MESSAGE_BODY_TYPE_NONE)
            {
                LogError("Body already set on received message");
                message_receiver->decode_error = true;
            }
            else
            {
                AMQP_VALUE body_amqp_value = amqpvalue_get_inplace_described_value(decoded_value);
                if (body_amqp_value == NULL)
                {
                    LogError("Error getting body AMQP value");
                    message_receiver->decode_error = true;
                }
                else
                {
                    if (message_set_body_amqp_value(decoded_message, body_amqp_value) != 0)
                    {
                        LogError("Error setting body AMQP value on received message");
                        message_receiver->decode_error = true;
                    }
                }
            }
        }
    }
    else if (is_data_type_by_descriptor(descriptor))
    {
        MESSAGE_BODY_TYPE body_type;
        if (message_get_body_type(decoded_message, &body_type) != 0)
        {
            LogError("Error getting message body type");
            message_receiver->decode_error = true;
        }
        else
        {
            if ((body_type != MESSAGE_BODY_TYPE_NONE) &&
                (body_type != MESSAGE_BODY_TYPE_DATA))
            {
                LogError("Message body type already set to something different than AMQP DATA");
                message_receiver->decode_error = true;
            }
            else
            {
                AMQP_VALUE body_data_value = amqpvalue_get_inplace_described_value(decoded_value);
                if (body_data_value == NULL)
                {
                    LogError("Error getting body DATA value");
                    message_receiver->decode_error = true;
                }
                else
                {
                    data data_value;
                    if (amqpvalue_get_data(body_data_value, &data_value) != 0)
                    {
                        LogError("Error getting body DATA AMQP value");
                        message_receiver->decode_error = true;
                    }
                    else
                    {
                        BINARY_DATA binary_data;
                        binary_data.bytes = (const unsigned char*)data_value.bytes;
                        binary_data.length = data_value.length;
                        if (message_add_body_amqp_data(decoded_message, binary_data) != 0)
                        {
                            LogError("Error adding body DATA to received message");
                            message_receiver->decode_error = true;
                        }
                    }
                }
            }
        }
    }
    else
    {
        LogError("Failed decoding descriptor");
        message_receiver->decode_error = true;
    }
}